

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

numeric_type __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>>::operator()
          (rt_variable<viennamath::rt_expression_interface<double>> *this,
          vector<double,_std::allocator<double>_> *v)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  
  if (*(ulong *)(this + 8) < (ulong)(*(long *)(v + 8) - *(long *)v >> 3)) {
    return *(numeric_type *)(*(long *)v + *(ulong *)(this + 8) * 8);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
  uVar1 = *(undefined8 *)(this + 8);
  lVar2 = *(long *)(v + 8);
  lVar3 = *(long *)v;
  *puVar4 = &PTR__exception_0010ea18;
  puVar4[1] = uVar1;
  puVar4[2] = lVar2 - lVar3 >> 3;
  __cxa_throw(puVar4,&variable_index_out_of_bounds_exception::typeinfo,std::exception::~exception);
}

Assistant:

numeric_type
      operator()(VectorType const & v) const
      {
        if(id_ >= v.size())
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), static_cast<long>(v.size()));
        return get_from_vector(v, id_);
      }